

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void jx9VmReleaseContextValue(jx9_context *pCtx,jx9_value *pValue)

{
  void *pvVar1;
  uint local_24;
  sxu32 n;
  jx9_value **apObj;
  jx9_value *pValue_local;
  jx9_context *pCtx_local;
  
  if ((pValue != (jx9_value *)0x0) && ((pCtx->sVar).nUsed != 0)) {
    pvVar1 = (pCtx->sVar).pBase;
    for (local_24 = 0; local_24 < (pCtx->sVar).nUsed; local_24 = local_24 + 1) {
      if (*(jx9_value **)((long)pvVar1 + (ulong)local_24 * 8) == pValue) {
        jx9MemObjRelease(pValue);
        SyMemBackendPoolFree(&pCtx->pVm->sAllocator,pValue);
        *(undefined8 *)((long)pvVar1 + (ulong)local_24 * 8) = 0;
        return;
      }
    }
  }
  return;
}

Assistant:

JX9_PRIVATE void jx9VmReleaseContextValue(
	jx9_context *pCtx, /* Call context */
	jx9_value *pValue  /* Release this value */
	)
{
	if( pValue == 0 ){
		/* NULL value is a harmless operation */
		return;
	}
	if( SySetUsed(&pCtx->sVar) > 0 ){
		jx9_value **apObj = (jx9_value **)SySetBasePtr(&pCtx->sVar);
		sxu32 n;
		for( n = 0 ; n < SySetUsed(&pCtx->sVar) ; ++n ){
			if( apObj[n] == pValue ){
				jx9MemObjRelease(pValue);
				SyMemBackendPoolFree(&pCtx->pVm->sAllocator, pValue);
				/* Mark as released */
				apObj[n] = 0;
				break;
			}
		}
	}
}